

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# party.cpp
# Opt level: O0

void __thiscall Party::RefreshMembers(Party *this,Character *character,bool create)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  reference ppCVar4;
  PacketAction local_a9;
  string local_a8;
  int local_88 [6];
  Character *local_70;
  Character *member;
  iterator __end1;
  iterator __begin1;
  vector<Character_*,_std::allocator<Character_*>_> *__range1;
  PacketBuilder builder;
  bool create_local;
  Character *character_local;
  Party *this_local;
  
  local_a9 = PACKET_CREATE;
  if (!create) {
    local_a9 = PACKET_LIST;
  }
  builder.add_size._7_1_ = create;
  sVar3 = std::vector<Character_*,_std::allocator<Character_*>_>::size(&this->members);
  PacketBuilder::PacketBuilder((PacketBuilder *)&__range1,PACKET_PARTY,local_a9,sVar3 * 0x12);
  __end1 = std::vector<Character_*,_std::allocator<Character_*>_>::begin(&this->members);
  member = (Character *)std::vector<Character_*,_std::allocator<Character_*>_>::end(&this->members);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Character_**,_std::vector<Character_*,_std::allocator<Character_*>_>_>
                                *)&member);
    if (!bVar1) break;
    ppCVar4 = __gnu_cxx::
              __normal_iterator<Character_**,_std::vector<Character_*,_std::allocator<Character_*>_>_>
              ::operator*(&__end1);
    local_70 = *ppCVar4;
    iVar2 = Character::PlayerID(local_70);
    PacketBuilder::AddShort((PacketBuilder *)&__range1,iVar2);
    PacketBuilder::AddChar((PacketBuilder *)&__range1,(uint)(local_70 == this->leader));
    PacketBuilder::AddChar((PacketBuilder *)&__range1,(uint)local_70->level);
    local_88[2] = (int)(((double)local_70->hp / (double)local_70->maxhp) * 100.0);
    local_88[1] = 0;
    local_88[0] = 100;
    iVar2 = util::clamp<int>(local_88 + 2,local_88 + 1,local_88);
    PacketBuilder::AddChar((PacketBuilder *)&__range1,iVar2);
    (*(local_70->super_Command_Source)._vptr_Command_Source[2])(&local_a8);
    PacketBuilder::AddBreakString((PacketBuilder *)&__range1,&local_a8,0xff);
    std::__cxx11::string::~string((string *)&local_a8);
    __gnu_cxx::
    __normal_iterator<Character_**,_std::vector<Character_*,_std::allocator<Character_*>_>_>::
    operator++(&__end1);
  }
  Character::Send(character,(PacketBuilder *)&__range1);
  PacketBuilder::~PacketBuilder((PacketBuilder *)&__range1);
  return;
}

Assistant:

void Party::RefreshMembers(Character *character, bool create)
{
	PacketBuilder builder(PACKET_PARTY, create ? PACKET_CREATE : PACKET_LIST, this->members.size() * 18);

	UTIL_FOREACH(this->members, member)
	{
		builder.AddShort(member->PlayerID());
		builder.AddChar(member == this->leader);
		builder.AddChar(member->level);
		builder.AddChar(util::clamp<int>(double(member->hp) / double(member->maxhp) * 100.0, 0, 100));
		builder.AddBreakString(member->SourceName());
	}

	character->Send(builder);
}